

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_int64 UnixFile_Write(void *pUserData,void *pBuffer,jx9_int64 nWrite)

{
  ssize_t sVar1;
  jx9_int64 nCount;
  long lVar2;
  
  lVar2 = 0;
  for (; 0 < nWrite; nWrite = nWrite - sVar1) {
    sVar1 = write((int)pUserData,pBuffer,nWrite);
    if (sVar1 < 1) break;
    lVar2 = lVar2 + sVar1;
    pBuffer = (void *)((long)pBuffer + sVar1);
  }
  if (0 < nWrite) {
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

static jx9_int64 UnixFile_Write(void *pUserData, const void *pBuffer, jx9_int64 nWrite)
{
	const char *zData = (const char *)pBuffer;
	int fd = SX_PTR_TO_INT(pUserData);
	jx9_int64 nCount;
	ssize_t nWr;
	nCount = 0;
	for(;;){
		if( nWrite < 1 ){
			break;
		}
		nWr = write(fd, zData, (size_t)nWrite);
		if( nWr < 1 ){
			/* IO error */
			break;
		}
		nWrite -= nWr;
		nCount += nWr;
		zData += nWr;
	}
	if( nWrite > 0 ){
		return -1;
	}
	return nCount;
}